

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bacNtk.c
# Opt level: O2

int Bac_NtkDfsUserBoxes(Bac_Ntk_t *p)

{
  int iVar1;
  int i;
  
  Bac_NtkStartCopies(p);
  (p->vArray).nSize = 0;
  i = 0;
  while( true ) {
    if ((p->vType).nSize <= i) {
      return 1;
    }
    iVar1 = Bac_ObjIsBoxUser(p,i);
    if ((iVar1 != 0) && (iVar1 = Bac_NtkDfsUserBoxes_rec(p,i,&p->vArray), iVar1 == 0)) break;
    i = i + 1;
  }
  puts("Cyclic dependency of user boxes is detected.");
  return 0;
}

Assistant:

int Bac_NtkDfsUserBoxes( Bac_Ntk_t * p )
{
    int iObj;
    Bac_NtkStartCopies( p ); // -1 = not visited; 0 = on the path; 1 = finished
    Vec_IntClear( &p->vArray );
    Bac_NtkForEachBoxUser( p, iObj )
        if ( !Bac_NtkDfsUserBoxes_rec( p, iObj, &p->vArray ) )
        {
            printf( "Cyclic dependency of user boxes is detected.\n" );
            return 0;
        }
    return 1;
}